

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)303>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  NeuralNetworkRegressor *nn;
  ModelDescription *pMVar4;
  Result r;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  Result local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pMVar4 = format->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateRegressorInterface(&local_70,pMVar4,format->specificationversion_);
  bVar3 = Result::good(&local_70);
  if (bVar3) {
    local_48._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48._M_impl.super__Rb_tree_header._M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar4 = format->description_;
    if (pMVar4 == (ModelDescription *)0x0) {
      pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    local_48._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    if (format->_oneof_case_[0] == 0x12f) {
      nn = (format->Type_).neuralnetworkregressor_;
    }
    else {
      nn = Specification::NeuralNetworkRegressor::default_instance();
    }
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkRegressor>
              (__return_storage_ptr__,pMVar4,nn,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48,format->isupdatable_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_48);
  }
  else {
    paVar2 = &local_70.m_message.field_2;
    __return_storage_ptr__->m_type = local_70.m_type;
    __return_storage_ptr__->m_reason = local_70.m_reason;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_message._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                    local_70.m_message.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
           local_70.m_message.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_70.m_message._M_dataplus._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                    local_70.m_message.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_70.m_message._M_string_length;
    local_70.m_message._M_string_length = 0;
    local_70.m_message.field_2._M_local_buf[0] = '\0';
    local_70.m_message._M_dataplus._M_p = (pointer)paVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
    operator_delete(local_70.m_message._M_dataplus._M_p,
                    CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                             local_70.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkRegressor>(const Specification::Model& format) {
        // must have regressor parameters
        Result r = validateRegressorInterface(format.description(), format.specificationversion());
        if (!r.good()) {
            return r;
        }
        
        std::set<std::string> outputBlobNames;
        return validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkregressor(), outputBlobNames, format.isupdatable());
    }